

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_sockaddr_cmp(sockaddr *sa1,sockaddr *sa2,int include_port)

{
  sockaddr_in6 *sin2_1;
  sockaddr_in6 *sin1_1;
  sockaddr_in *sin2;
  sockaddr_in *sin1;
  int r;
  int include_port_local;
  sockaddr *sa2_local;
  sockaddr *sa1_local;
  
  sa1_local._4_4_ = (uint)sa1->sa_family - (uint)sa2->sa_family;
  if (sa1_local._4_4_ == 0) {
    if (sa1->sa_family == 2) {
      if (*(uint *)(sa1->sa_data + 2) < *(uint *)(sa2->sa_data + 2)) {
        sa1_local._4_4_ = -1;
      }
      else if (*(uint *)(sa2->sa_data + 2) < *(uint *)(sa1->sa_data + 2)) {
        sa1_local._4_4_ = 1;
      }
      else if ((include_port == 0) ||
              (sa1_local._4_4_ = (uint)*(ushort *)sa1->sa_data - (uint)*(ushort *)sa2->sa_data,
              sa1_local._4_4_ == 0)) {
        sa1_local._4_4_ = 0;
      }
    }
    else if (sa1->sa_family == 10) {
      sa1_local._4_4_ = memcmp(sa1->sa_data + 6,sa2->sa_data + 6,0x10);
      if ((sa1_local._4_4_ == 0) &&
         ((include_port == 0 ||
          (sa1_local._4_4_ = (uint)*(ushort *)sa1->sa_data - (uint)*(ushort *)sa2->sa_data,
          sa1_local._4_4_ == 0)))) {
        sa1_local._4_4_ = 0;
      }
    }
    else {
      sa1_local._4_4_ = 1;
    }
  }
  return sa1_local._4_4_;
}

Assistant:

int
evutil_sockaddr_cmp(const struct sockaddr *sa1, const struct sockaddr *sa2,
    int include_port)
{
	int r;
	if (0 != (r = (sa1->sa_family - sa2->sa_family)))
		return r;

	if (sa1->sa_family == AF_INET) {
		const struct sockaddr_in *sin1, *sin2;
		sin1 = (const struct sockaddr_in *)sa1;
		sin2 = (const struct sockaddr_in *)sa2;
		if (sin1->sin_addr.s_addr < sin2->sin_addr.s_addr)
			return -1;
		else if (sin1->sin_addr.s_addr > sin2->sin_addr.s_addr)
			return 1;
		else if (include_port &&
		    (r = ((int)sin1->sin_port - (int)sin2->sin_port)))
			return r;
		else
			return 0;
	}
#ifdef AF_INET6
	else if (sa1->sa_family == AF_INET6) {
		const struct sockaddr_in6 *sin1, *sin2;
		sin1 = (const struct sockaddr_in6 *)sa1;
		sin2 = (const struct sockaddr_in6 *)sa2;
		if ((r = memcmp(sin1->sin6_addr.s6_addr, sin2->sin6_addr.s6_addr, 16)))
			return r;
		else if (include_port &&
		    (r = ((int)sin1->sin6_port - (int)sin2->sin6_port)))
			return r;
		else
			return 0;
	}
#endif
	return 1;
}